

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

_Bool rect_2D_contains_point(rect_2D rect,vec2 pt)

{
  if (((rect.top_left.x <= pt.x) && (pt.x <= rect.top_left.x + rect.size.x)) &&
     (pt.y <= rect.top_left.y)) {
    return rect.top_left.y - rect.size.y <= pt.y;
  }
  return false;
}

Assistant:

bool rect_2D_contains_point(struct rect_2D rect, vec2 pt) {
    vec2 p0 = rect.top_left;
    vec2 p1 = V2(p0.x + rect.size.x, p0.y - rect.size.y);
    return pt.x >= p0.x && pt.x <= p1.x &&
        pt.y <= p0.y && pt.y >= p1.y;
}